

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

bool __thiscall ON_BoundingBox::GetCorners(ON_BoundingBox *this,ON_3dPoint *corners)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  ON_3dPoint *pOVar6;
  bool bVar7;
  long lVar8;
  bool bVar9;
  ON_BoundingBox *pOVar10;
  double *pdVar11;
  
  bVar7 = IsNotEmpty(this);
  if (bVar7) {
    lVar8 = 0;
    bVar7 = true;
    do {
      bVar5 = bVar7;
      pOVar10 = (ON_BoundingBox *)&this->m_max;
      if (bVar5) {
        pOVar10 = this;
      }
      dVar1 = (pOVar10->m_min).x;
      bVar7 = true;
      do {
        bVar4 = bVar7;
        pOVar6 = &this->m_max;
        if (bVar4) {
          pOVar6 = &this->m_min;
        }
        dVar2 = pOVar6->y;
        pdVar11 = &corners[(int)lVar8].z;
        lVar8 = (long)(int)lVar8 + 2;
        bVar7 = true;
        do {
          bVar9 = bVar7;
          pOVar6 = &this->m_max;
          if (bVar9) {
            pOVar6 = &this->m_min;
          }
          dVar3 = pOVar6->z;
          ((ON_3dPoint *)(pdVar11 + -2))->x = dVar1;
          pdVar11[-1] = dVar2;
          *pdVar11 = dVar3;
          pdVar11 = pdVar11 + 3;
          bVar7 = false;
        } while (bVar9);
        bVar7 = false;
      } while (bVar4);
      bVar7 = false;
    } while (bVar5);
    bVar7 = lVar8 == 8;
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool
ON_BoundingBox::GetCorners( 
  ON_3dPoint corners[8]// returns list of 8 corner points
  ) const
{
  int n = 0;
  if ( IsValid() ) 
  {
    ON_3dPoint P;
    int i,j,k;
    for( i = 0; i < 2; i++ ) 
    {
      P.x = (i) ? m_max.x : m_min.x;
      for ( j = 0; j < 2; j++ )
      {
        P.y = (j) ? m_max.y : m_min.y;
        for ( k = 0; k < 2; k++ )
        {
          P.z = (k) ? m_max.z : m_min.z;
          corners[n++] = P;
        }
      }
    }
  }
  return (8==n);
}